

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O0

void __thiscall PFData_test_fileFromData_Test::TestBody(PFData_test_fileFromData_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int __fd;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  PFData test_read;
  AssertionResult gtest_ar_2;
  int p;
  AssertionResult gtest_ar_1;
  int q;
  AssertionResult gtest_ar;
  int r;
  PFData test;
  int i;
  double data [24];
  int retval;
  PFData *in_stack_fffffffffffff8e0;
  undefined7 in_stack_fffffffffffff8e8;
  undefined1 in_stack_fffffffffffff8ef;
  char *in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff8fc;
  int line;
  char *in_stack_fffffffffffff900;
  string *in_stack_fffffffffffff908;
  Type type;
  int in_stack_fffffffffffff910;
  int in_stack_fffffffffffff914;
  undefined4 uVar4;
  double *in_stack_fffffffffffff918;
  PFData *in_stack_fffffffffffff920;
  string *in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  Message *in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff964;
  PFData *in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  AssertionResult local_590;
  undefined1 local_578 [8];
  char *local_570;
  undefined4 local_564;
  AssertionResult local_560 [2];
  double local_540;
  undefined4 local_534;
  AssertionResult local_530 [2];
  double local_510;
  undefined4 local_504;
  AssertionResult local_500 [2];
  int local_4e0;
  undefined4 local_4dc;
  AssertionResult local_4d8 [2];
  int local_4b8;
  undefined4 local_4b4;
  AssertionResult local_4b0 [2];
  int local_490;
  undefined4 local_48c;
  AssertionResult local_488 [2];
  double local_468;
  undefined4 local_45c;
  AssertionResult local_458 [2];
  double local_438;
  undefined4 local_42c;
  AssertionResult local_428 [2];
  double local_408;
  undefined4 local_3fc;
  AssertionResult local_3f8 [2];
  undefined4 local_3d4;
  AssertionResult local_3d0 [2];
  undefined4 local_3ac;
  AssertionResult local_3a8 [2];
  undefined4 local_384;
  AssertionResult local_380 [2];
  undefined4 local_35c;
  AssertionResult local_358 [2];
  undefined4 local_334;
  AssertionResult local_330;
  allocator local_319;
  string local_318 [32];
  PFData local_2f8;
  allocator local_249;
  string local_248 [52];
  undefined4 local_214;
  AssertionResult local_210;
  int local_1fc;
  undefined4 local_1e4;
  AssertionResult local_1e0;
  int local_1cc;
  undefined4 local_1b4;
  AssertionResult local_1b0 [2];
  int local_18c;
  PFData local_188;
  int local_dc;
  double local_d8 [25];
  int local_c;
  
  local_c = 0xffffffff;
  for (local_dc = 0; local_dc < 0x18; local_dc = local_dc + 1) {
    iVar2 = rand();
    local_d8[local_dc] = (double)iVar2 / 1000.0;
  }
  PFData::PFData(in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff914,
                 in_stack_fffffffffffff910,(int)((ulong)in_stack_fffffffffffff908 >> 0x20));
  local_18c = PFData::getR(&local_188);
  local_1b4 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x125867);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               (Type)((ulong)in_stack_fffffffffffff908 >> 0x20),in_stack_fffffffffffff900,
               in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x1258ca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125922);
  local_1cc = PFData::getQ(&local_188);
  local_1e4 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x1259ed);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               (Type)((ulong)in_stack_fffffffffffff908 >> 0x20),in_stack_fffffffffffff900,
               in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x125a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125aa8);
  local_1fc = PFData::getP(&local_188);
  local_214 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x125b73);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               (Type)((ulong)in_stack_fffffffffffff908 >> 0x20),in_stack_fffffffffffff900,
               in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x125bd6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125c2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"tests/pfb_file_from_data.pfb",&local_249);
  local_c = PFData::writeFile((PFData *)
                              CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                              in_stack_fffffffffffff948);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"tests/pfb_file_from_data.pfb",&local_319);
  PFData::PFData((PFData *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                 in_stack_fffffffffffff908);
  type = (Type)((ulong)in_stack_fffffffffffff908 >> 0x20);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  local_c = PFData::loadHeader((PFData *)
                               CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
  local_334 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_330);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x125e84);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x125ee7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125f3f);
  local_c = PFData::loadData(in_stack_fffffffffffff998);
  local_35c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_358);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x12600a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x12606d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1260c5);
  local_18c = PFData::getR(&local_2f8);
  local_384 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_380);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x126190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x1261f3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12624b);
  local_1cc = PFData::getQ(&local_2f8);
  local_3ac = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x126316);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x126379);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1263d1);
  local_1fc = PFData::getP(&local_2f8);
  local_3d4 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x12649c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x1264ff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x126557);
  local_3fc = 1;
  local_408 = PFData::getDZ(&local_2f8);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (double *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3f8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x126628);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x12668b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1266e3);
  local_42c = 1;
  local_438 = PFData::getDY(&local_2f8);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (double *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x1267b4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x126817);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12686f);
  local_45c = 1;
  local_468 = PFData::getDX(&local_2f8);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (double *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_458);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x126940);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x1269a3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1269fb);
  local_48c = 1;
  iVar2 = PFData::getNZ(&local_2f8);
  local_490 = iVar2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_488);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff960);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    in_stack_fffffffffffff958 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x126ac6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,uVar5),in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x126b29);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x126b81);
  local_4b4 = 4;
  local_4b8 = PFData::getNY(&local_2f8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x126c40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,uVar5),in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x126c9d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x126cf5);
  local_4dc = 6;
  local_4e0 = PFData::getNX(&local_2f8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4d8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x126db4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,uVar5),in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x126e11);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x126e69);
  local_504 = 0;
  local_510 = PFData::getZ(&local_2f8);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (double *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_500);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    testing::AssertionResult::failure_message((AssertionResult *)0x126f2e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,uVar5),in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x126f8b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x126fe3);
  local_534 = 0;
  local_540 = PFData::getY(&local_2f8);
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (double *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_530);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff914);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar4,in_stack_fffffffffffff910));
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1270a8);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,in_stack_fffffffffffff910),type,
               in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,uVar5),in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x127105);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12715d);
  local_564 = 0;
  pcVar3 = (char *)PFData::getX(&local_2f8);
  __fd = 0x189c68;
  local_570 = pcVar3;
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (double *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_560);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8fc);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar4,in_stack_fffffffffffff910));
    in_stack_fffffffffffff8f0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x127222);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,in_stack_fffffffffffff910),type,pcVar3,line,
               in_stack_fffffffffffff8f0);
    __fd = (int)local_578;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,uVar5),in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x12727f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1272d7);
  PFData::close(&local_2f8,__fd);
  PFData::close(&local_188,__fd);
  remove("tests/pfb_file_from_data.pfb");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(line,in_stack_fffffffffffff8f8),in_stack_fffffffffffff8f0,
             (int *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
             (int *)in_stack_fffffffffffff8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_590);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar4,in_stack_fffffffffffff910));
    in_stack_fffffffffffff8e0 =
         (PFData *)testing::AssertionResult::failure_message((AssertionResult *)0x1273a9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,in_stack_fffffffffffff910),type,pcVar3,line,
               in_stack_fffffffffffff8f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar2,uVar5),in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
    testing::Message::~Message((Message *)0x127406);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127471);
  PFData::~PFData(in_stack_fffffffffffff8e0);
  PFData::~PFData(in_stack_fffffffffffff8e0);
  return;
}

Assistant:

TEST_F(PFData_test, fileFromData){
    int retval = -1;
    double data[24];
    for (int i =0; i<24; i++){
        data[i] = (double) rand() / 1000;
    }
    PFData test(data, 1, 4, 6);
    int r = test.getR();
    EXPECT_EQ(1, r);
    int q = test.getQ();
    EXPECT_EQ(1, q);
    int p = test.getP();
    EXPECT_EQ(1, p);
    retval = test.writeFile("tests/pfb_file_from_data.pfb");

    PFData test_read("tests/pfb_file_from_data.pfb");
    retval = test_read.loadHeader();
    EXPECT_EQ(0, retval);
    retval = test_read.loadData();
    EXPECT_EQ(0, retval);
    r = test_read.getR();
    EXPECT_EQ(1, r);
    q = test_read.getQ();
    EXPECT_EQ(1, q);
    p = test_read.getP();
    EXPECT_EQ(1, p);
    EXPECT_EQ(1, test_read.getDZ());
    EXPECT_EQ(1, test_read.getDY());
    EXPECT_EQ(1, test_read.getDX());
    EXPECT_EQ(1, test_read.getNZ());
    EXPECT_EQ(4, test_read.getNY());
    EXPECT_EQ(6, test_read.getNX());
    EXPECT_EQ(0, test_read.getZ());
    EXPECT_EQ(0, test_read.getY());
    EXPECT_EQ(0, test_read.getX());
    test_read.close();
    test.close();
    ASSERT_EQ(0,remove("tests/pfb_file_from_data.pfb"));
}